

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::iterate
          (TextureBorderClampPerAxisCase3D *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TextureFormat format;
  code *pcVar3;
  RenderContext *context;
  Texture3D *pTVar4;
  TestLog *pTVar5;
  float *pfVar6;
  int i;
  int iVar7;
  deUint32 dVar8;
  char *pcVar9;
  size_t sVar10;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  SeedBuilder *pSVar12;
  long lVar13;
  int i_4;
  Surface *pSVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  void *data;
  string local_408;
  undefined1 local_3e8 [24];
  undefined2 local_3d0;
  undefined2 uStack_3ce;
  undefined1 local_3cc;
  Surface renderedFrame;
  undefined1 local_3a8 [24];
  undefined8 local_390;
  size_type sStack_388;
  BVec4 local_380;
  Surface reference;
  string local_360;
  string local_340;
  Surface errorMask;
  LodPrecision lodPrecision;
  string borderColorString;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [6];
  ostringstream s;
  ChannelType CStack_264;
  size_type sStack_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_238 [4];
  ios_base local_1f8 [8];
  ios_base local_1f0 [264];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  ReferenceParams samplerParams;
  
  tcu::Surface::Surface(&renderedFrame,0x80,0x80);
  format = (((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
             .m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_format;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&samplerParams,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)&s,this->m_sWrap,this->m_tWrap,this->m_rWrap,this->m_filter,
                    this->m_filter);
  samplerParams.sampler.magFilter = local_258._M_allocated_capacity._0_4_;
  samplerParams.sampler.lodThreshold = (float)local_258._M_allocated_capacity._4_4_;
  samplerParams.sampler.normalizedCoords = (bool)local_258._M_local_buf[8];
  samplerParams.sampler._25_3_ = local_258._9_3_;
  samplerParams.sampler.compare = local_258._12_4_;
  samplerParams.sampler.wrapS = _s;
  samplerParams.sampler.wrapT = CStack_264;
  samplerParams.sampler.wrapR = (undefined4)sStack_260;
  samplerParams.sampler.minFilter = sStack_260._4_4_;
  samplerParams.sampler.compareChannel = (int)local_248._M_p;
  samplerParams.sampler.borderColor.v.uData[0] = (this->m_borderColor).v.uData[0];
  samplerParams.sampler.borderColor.v.uData[1] = (this->m_borderColor).v.uData[1];
  samplerParams.sampler.borderColor.v._8_8_ = *(undefined8 *)((long)&(this->m_borderColor).v + 8);
  samplerParams.lodMode = LODMODE_EXACT;
  samplerParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(format);
  samplerParams.super_RenderParams.colorScale.m_data._0_8_ =
       *(undefined8 *)(this->m_lookupScale).m_data;
  samplerParams.super_RenderParams.colorScale.m_data._8_8_ =
       *(undefined8 *)((this->m_lookupScale).m_data + 2);
  samplerParams.super_RenderParams.colorBias.m_data._0_8_ =
       *(undefined8 *)(this->m_lookupBias).m_data;
  samplerParams.super_RenderParams.colorBias.m_data._8_8_ =
       *(undefined8 *)((this->m_lookupBias).m_data + 2);
  if (this->m_channelClass == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_3a8._0_8_ = *(undefined8 *)&(this->m_borderColor).v;
    pfVar6 = (float *)((long)&(this->m_borderColor).v + 8);
    local_3a8._8_4_ = pfVar6[0];
    local_3a8._12_4_ = pfVar6[1];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<unsigned_int,_4> *)local_3a8);
    std::__cxx11::stringbuf::str();
  }
  else if (this->m_channelClass == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    local_3a8._0_8_ = *(undefined8 *)&(this->m_borderColor).v;
    pfVar6 = (float *)((long)&(this->m_borderColor).v + 8);
    local_3a8._8_4_ = pfVar6[0];
    local_3a8._12_4_ = pfVar6[1];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<int,_4> *)local_3a8);
    std::__cxx11::stringbuf::str();
  }
  else {
    local_3a8._0_8_ = *(undefined8 *)&(this->m_borderColor).v;
    pfVar6 = (float *)((long)&(this->m_borderColor).v + 8);
    local_3a8._8_4_ = pfVar6[0];
    local_3a8._12_4_ = pfVar6[1];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    tcu::operator<<((ostream *)&s,(Vector<float,_4> *)local_3a8);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  std::ios_base::~ios_base(local_1f8);
  _s = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Border color is ",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,borderColorString._M_dataplus._M_p,
             borderColorString._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,"Texture lookup bias: ",0x15);
  tcu::operator<<((ostream *)&sStack_260,&samplerParams.super_RenderParams.colorBias);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&sStack_260,"Texture lookup scale: ",0x16);
  tcu::operator<<((ostream *)&sStack_260,&samplerParams.super_RenderParams.colorScale);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Filter: ",8);
  pcVar9 = glu::getTextureFilterName(this->m_filter);
  if (pcVar9 == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&sStack_260 + (int)*(undefined8 *)(sStack_260 - 0x18));
  }
  else {
    sVar10 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,pcVar9,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"Wrap mode: s = ",0xf);
  local_3a8._0_8_ = glu::getRepeatModeName;
  local_3a8._8_4_ = this->m_sWrap;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_3a8,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,", t = ",6);
  local_3e8._0_8_ = glu::getRepeatModeName;
  local_3e8._8_4_ = this->m_tWrap;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_3e8,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,", r = ",6);
  local_408._M_dataplus._M_p = (pointer)glu::getRepeatModeName;
  local_408._M_string_length = CONCAT44(local_408._M_string_length._4_4_,this->m_rWrap);
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_408,(ostream *)&sStack_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&sStack_260,"\n",1);
  tcu::MessageBuilder::operator<<((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_260);
  std::ios_base::~ios_base(local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
    operator_delete(borderColorString._M_dataplus._M_p,
                    borderColorString.field_2._M_allocated_capacity + 1);
  }
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar7);
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::SeedBuilder::SeedBuilder((SeedBuilder *)&borderColorString);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p,
             (allocator<char> *)local_3a8);
  pSVar12 = tcu::operator<<((SeedBuilder *)&borderColorString,(string *)&s);
  pSVar12 = tcu::operator<<(pSVar12,this->m_texFormat);
  pSVar12 = tcu::operator<<(pSVar12,this->m_filter);
  pSVar12 = tcu::operator<<(pSVar12,this->m_sWrap);
  pSVar12 = tcu::operator<<(pSVar12,this->m_tWrap);
  pSVar12 = tcu::operator<<(pSVar12,this->m_rWrap);
  pSVar12 = tcu::operator<<(pSVar12,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_width);
  pSVar12 = tcu::operator<<(pSVar12,(((this->m_texture).
                                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>
                                      .m_data.ptr)->m_refTexture).m_height);
  tcu::operator<<(pSVar12,(((this->m_texture).
                            super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
                            m_data.ptr)->m_refTexture).m_depth);
  if (_s != (TextureFormat)&local_258) {
    operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
  }
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&borderColorString,pRVar11,0x80,0x80,
             (deUint32)borderColorString._M_dataplus._M_p);
  (**(code **)(lVar13 + 8))(0x84c0);
  (**(code **)(lVar13 + 0xb8))
            (0x806f,((this->m_texture).
                     super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data.
                    ptr)->m_glTexture);
  pcVar3 = *(code **)(lVar13 + 0x1360);
  dVar8 = glu::getGLWrapMode(samplerParams.sampler.wrapS);
  (*pcVar3)(0x806f,0x2802,dVar8);
  pcVar3 = *(code **)(lVar13 + 0x1360);
  dVar8 = glu::getGLWrapMode(samplerParams.sampler.wrapT);
  (*pcVar3)(0x806f,0x2803,dVar8);
  pcVar3 = *(code **)(lVar13 + 0x1360);
  dVar8 = glu::getGLWrapMode(samplerParams.sampler.wrapR);
  (*pcVar3)(0x806f,0x8072,dVar8);
  pcVar3 = *(code **)(lVar13 + 0x1360);
  dVar8 = glu::getGLFilterMode(samplerParams.sampler.minFilter);
  (*pcVar3)(0x806f,0x2801,dVar8);
  pcVar3 = *(code **)(lVar13 + 0x1360);
  dVar8 = glu::getGLFilterMode(samplerParams.sampler.magFilter);
  (*pcVar3)(0x806f,0x2800,dVar8);
  if ((ulong)this->m_channelClass < 5) {
    (**(code **)(lVar13 + *(long *)(&DAT_0098fc40 + (ulong)this->m_channelClass * 8)))
              (0x806f,0x1004,&this->m_borderColor);
  }
  dVar8 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar8,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBorderClampTests.cpp"
                  ,0x897);
  (**(code **)(lVar13 + 0x1a00))
            ((ulong)borderColorString._M_dataplus._M_p & 0xffffffff,
             borderColorString._M_dataplus._M_p._4_4_,
             borderColorString._M_string_length & 0xffffffff,
             borderColorString._M_string_length._4_4_);
  gls::TextureTestUtil::TextureRenderer::renderQuad
            ((this->m_renderer).
             super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
             .m_data.ptr,0,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&samplerParams.super_RenderParams);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_3a8._0_8_ = (GetNameFunc)0x300000008;
  data = (void *)renderedFrame.m_pixels.m_cap;
  if (renderedFrame.m_pixels.m_cap != 0) {
    data = renderedFrame.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&s,(TextureFormat *)local_3a8,renderedFrame.m_width,
             renderedFrame.m_height,1,data);
  glu::readPixels(context,(deUint32)borderColorString._M_dataplus._M_p,
                  borderColorString._M_dataplus._M_p._4_4_,(PixelBufferAccess *)&s);
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat._0_8_ = *(undefined8 *)&pRVar11->m_pixelFormat;
  pixelFormat.blueBits = (pRVar11->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar11->m_pixelFormat).alphaBits;
  borderColorString._M_dataplus._M_p = (pointer)pixelFormat._0_8_;
  borderColorString._M_string_length = pixelFormat._8_8_;
  lVar13 = 0;
  do {
    *(undefined4 *)(local_3a8 + lVar13 * 4) = 2;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  _s = R;
  CStack_264 = SNORM_INT8;
  sStack_260 = 0;
  lVar13 = 0;
  do {
    *(int *)(&s + lVar13 * 4) =
         *(int *)((long)&borderColorString._M_dataplus._M_p + lVar13 * 4) -
         *(int *)(local_3a8 + lVar13 * 4);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_3e8._0_4_ = R;
  local_3e8._4_4_ = SNORM_INT8;
  local_3e8._8_8_ = 0;
  colorBits.m_data[0] = 0;
  colorBits.m_data[1] = 0;
  colorBits.m_data[2] = 0;
  colorBits.m_data[3] = 0;
  lVar13 = 0;
  do {
    iVar7 = *(int *)(local_3e8 + lVar13 * 4);
    if (*(int *)(local_3e8 + lVar13 * 4) < *(int *)(&s + lVar13 * 4)) {
      iVar7 = *(int *)(&s + lVar13 * 4);
    }
    colorBits.m_data[lVar13] = iVar7;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  tcu::Surface::Surface(&reference,renderedFrame.m_width,renderedFrame.m_height);
  tcu::Surface::Surface(&errorMask,renderedFrame.m_width,renderedFrame.m_height);
  lodPrecision.rule = RULE_OPENGL;
  lVar13 = 0;
  do {
    *(undefined4 *)(local_3a8 + lVar13 * 4) = 0x16;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 3;
  do {
    *(undefined4 *)(local_3a8 + lVar13 * 4) = 0x10;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 6);
  local_390._0_4_ = 0.0;
  local_390._4_4_ = 0.0;
  sStack_388._0_4_ = 0.0;
  sStack_388._4_4_ = 0.0;
  local_380.m_data[0] = true;
  local_380.m_data[1] = true;
  local_380.m_data[2] = true;
  local_380.m_data[3] = true;
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 5;
  tcu::computeFixedPointThreshold((tcu *)&borderColorString,&colorBits);
  _s = R;
  CStack_264 = SNORM_INT8;
  sStack_260 = 0;
  lVar13 = 0;
  do {
    *(float *)(&s + lVar13 * 4) =
         *(float *)((long)&borderColorString._M_dataplus._M_p + lVar13 * 4) /
         samplerParams.super_RenderParams.colorScale.m_data[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  local_390 = _s;
  sStack_388 = sStack_260;
  local_3a8._0_8_ = (GetNameFunc)0x1400000014;
  local_3a8._8_4_ = 0;
  local_3a8._12_4_ = 5;
  local_3a8._16_4_ = 5;
  local_3a8._20_4_ = 0;
  local_380.m_data[1] = 0 < pixelFormat.greenBits;
  local_380.m_data[0] = 0 < pixelFormat.redBits;
  local_380.m_data[2] = 0 < pixelFormat.blueBits;
  local_380.m_data[3] = 0 < pixelFormat.alphaBits;
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)&s,&reference,&pixelFormat);
  pTVar4 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  borderColorString._M_string_length = (size_type)(pTVar4->m_refTexture).m_view.m_levels;
  borderColorString._M_dataplus._M_p._0_4_ = (pTVar4->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&s,(Texture3DView *)&borderColorString,
             (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&samplerParams);
  borderColorString._M_dataplus._M_p = (pointer)0x300000008;
  if (renderedFrame.m_pixels.m_cap != 0) {
    renderedFrame.m_pixels.m_cap = (size_t)renderedFrame.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&s,(TextureFormat *)&borderColorString,renderedFrame.m_width,
             renderedFrame.m_height,1,(void *)renderedFrame.m_pixels.m_cap);
  local_3e8._0_4_ = RGBA;
  local_3e8._4_4_ = UNORM_INT8;
  if (reference.m_pixels.m_cap != 0) {
    reference.m_pixels.m_cap = (size_t)reference.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&borderColorString,(TextureFormat *)local_3e8,reference.m_width,
             reference.m_height,1,(void *)reference.m_pixels.m_cap);
  local_408._M_dataplus._M_p = (pointer)0x300000008;
  if (errorMask.m_pixels.m_cap != 0) {
    errorMask.m_pixels.m_cap = (size_t)errorMask.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_3e8,(TextureFormat *)&local_408,errorMask.m_width,
             errorMask.m_height,1,(void *)errorMask.m_pixels.m_cap);
  pTVar4 = (this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
           m_data.ptr;
  local_408._M_string_length = (size_type)(pTVar4->m_refTexture).m_view.m_levels;
  local_408._M_dataplus._M_p._0_4_ = (pTVar4->m_refTexture).m_view.m_numLevels;
  iVar7 = glu::TextureTestUtil::computeTextureLookupDiff
                    ((ConstPixelBufferAccess *)&s,(ConstPixelBufferAccess *)&borderColorString,
                     (PixelBufferAccess *)local_3e8,(Texture3DView *)&local_408,
                     (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,&samplerParams,(LookupPrecision *)local_3a8,
                     &lodPrecision,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog);
  if (0 < iVar7) {
    _s = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sStack_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&sStack_260,"ERROR: Result verification failed, got ",0x27);
    std::ostream::operator<<((ostringstream *)&sStack_260,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&sStack_260," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sStack_260);
    std::ios_base::~ios_base(local_1f0);
  }
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_3e8._0_8_ = (long)local_3e8 + 0x10;
  local_3e8._16_8_ = 0x6552796669726556;
  _local_3d0 = 0x746c7573;
  local_3e8._8_8_ = 0xc;
  local_3cc = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  _s = S;
  CStack_264 = SNORM_INT8;
  local_408._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_408,(ulong)&s);
  local_408.field_2._M_allocated_capacity._0_4_ = _s;
  local_408.field_2._M_allocated_capacity._4_4_ = CStack_264;
  builtin_strncpy(local_408._M_dataplus._M_p,"Verification result",0x13);
  local_408._M_string_length._0_4_ = _s;
  local_408._M_string_length._4_4_ = CStack_264;
  local_408._M_dataplus._M_p[(long)_s] = '\0';
  tcu::LogImageSet::LogImageSet((LogImageSet *)&borderColorString,(string *)local_3e8,&local_408);
  tcu::TestLog::startImageSet(pTVar5,borderColorString._M_dataplus._M_p,local_2d8._M_p);
  paVar1 = &local_340.field_2;
  local_340.field_2._M_allocated_capacity = 0x64657265646e6552;
  local_340._M_string_length = 8;
  local_340.field_2._8_2_ = (ushort)(byte)local_340.field_2._M_local_buf[9] << 8;
  paVar2 = &local_360.field_2;
  local_360.field_2._M_allocated_capacity._0_6_ = 0x7265646e6552;
  local_360.field_2._M_allocated_capacity._6_2_ = 0x6465;
  local_360.field_2._8_2_ = 0x6920;
  local_360.field_2._10_4_ = 0x6567616d;
  local_360._M_string_length = 0xe;
  local_360.field_2._M_local_buf[0xe] = '\0';
  pSVar14 = &renderedFrame;
  local_360._M_dataplus._M_p = (pointer)paVar2;
  local_340._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogImage::LogImage
            ((LogImage *)&s,&local_340,&local_360,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&s,(int)pTVar5,__buf,(size_t)pSVar14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != aaStack_238) {
    operator_delete(local_248._M_p,
                    CONCAT44(aaStack_238[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_238[0]._M_allocated_capacity) + 1);
  }
  if (_s != (TextureFormat)&local_258) {
    operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar2) {
    operator_delete(local_360._M_dataplus._M_p,
                    CONCAT26(local_360.field_2._M_allocated_capacity._6_2_,
                             local_360.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != paVar1) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
    operator_delete(borderColorString._M_dataplus._M_p,
                    borderColorString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if (local_3e8._0_8_ != (long)local_3e8 + 0x10) {
    operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
  }
  if (0 < iVar7) {
    pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_3e8._0_8_ = (long)local_3e8 + 0x10;
    local_3e8._16_8_ = 0x636e657265666552;
    local_3d0 = 0x65;
    local_3e8._8_8_ = 9;
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    borderColorString._M_dataplus._M_p = (pointer)0x15;
    local_408._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_408,(ulong)&borderColorString);
    local_408.field_2._M_allocated_capacity = (size_type)borderColorString._M_dataplus._M_p;
    builtin_strncpy(local_408._M_dataplus._M_p,"Ideal reference image",0x15);
    local_408._M_string_length = (size_type)borderColorString._M_dataplus._M_p;
    borderColorString._M_dataplus._M_p[(long)local_408._M_dataplus._M_p] = '\0';
    pSVar14 = &reference;
    tcu::LogImage::LogImage
              ((LogImage *)&s,(string *)local_3e8,&local_408,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    __fd = (int)pTVar5;
    tcu::LogImage::write((LogImage *)&s,__fd,__buf_00,(size_t)pSVar14);
    local_340.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_340.field_2._8_2_ = 0x6b;
    local_340._M_string_length = 9;
    local_360.field_2._M_allocated_capacity._0_6_ = 0x20726f727245;
    local_360.field_2._M_allocated_capacity._6_2_ = 0x616d;
    local_360.field_2._8_2_ = 0x6b73;
    local_360._M_string_length = 10;
    local_360.field_2._10_4_ = local_360.field_2._10_4_ & 0xffffff00;
    pSVar14 = &errorMask;
    local_360._M_dataplus._M_p = (pointer)paVar2;
    local_340._M_dataplus._M_p = (pointer)paVar1;
    tcu::LogImage::LogImage
              ((LogImage *)&borderColorString,&local_340,&local_360,pSVar14,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&borderColorString,__fd,__buf_01,(size_t)pSVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)borderColorString._M_dataplus._M_p != &borderColorString.field_2) {
      operator_delete(borderColorString._M_dataplus._M_p,
                      borderColorString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != paVar2) {
      operator_delete(local_360._M_dataplus._M_p,
                      CONCAT26(local_360.field_2._M_allocated_capacity._6_2_,
                               local_360.field_2._M_allocated_capacity._0_6_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar1) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != aaStack_238) {
      operator_delete(local_248._M_p,
                      CONCAT44(aaStack_238[0]._M_allocated_capacity._4_4_,
                               (undefined4)aaStack_238[0]._M_allocated_capacity) + 1);
    }
    if (_s != (TextureFormat)&local_258) {
      operator_delete((void *)_s,local_258._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8._0_8_ != (long)local_3e8 + 0x10) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  pcVar9 = "Pass";
  if (iVar7 != 0) {
    pcVar9 = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar7 != 0),
             pcVar9);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&reference);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureBorderClampPerAxisCase3D::IterateResult TextureBorderClampPerAxisCase3D::iterate (void)
{
	tcu::Surface								renderedFrame		(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const glu::TextureTestUtil::ReferenceParams	samplerParams		= getSamplerParams();

	logParams(samplerParams);
	renderTo(renderedFrame, samplerParams);
	verifyImage(renderedFrame, samplerParams);

	return STOP;
}